

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O1

void rtosc::walk_ports(Ports *base,char *name_buffer,size_t buffer_size,void *data,
                      port_walker_t walker,bool expand_bundles,void *runtime,bool ranges)

{
  char *old_end;
  char cVar1;
  Port *pPVar2;
  char *__s;
  bool bVar3;
  size_t sVar4;
  Port *pPVar5;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  port_walker_t walker_local;
  ulong local_40;
  char *local_38;
  
  if (base != (Ports *)0x0) {
    if (*name_buffer == '\0') {
      *name_buffer = '/';
    }
    walker_local = walker;
    sVar4 = strlen(name_buffer);
    pPVar5 = Ports::operator[](base,"self:");
    bVar3 = port_is_enabled(pPVar5,name_buffer,buffer_size,base,runtime,false,walker,data);
    if (bVar3) {
      pPVar5 = (base->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
               super__Vector_impl_data._M_start;
      pPVar2 = (base->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pPVar5 != pPVar2) {
        old_end = name_buffer + sVar4;
        local_38 = name_buffer + -1;
        uVar9 = (ulong)expand_bundles;
        local_40 = uVar9;
        do {
          if (pPVar5->ports == (Ports *)0x0) {
            __s = pPVar5->name;
            pcVar6 = strchr(__s,0x23);
            uVar9 = local_40;
            pcVar8 = local_38;
            if (pcVar6 == (char *)0x0) {
              do {
                pcVar6 = pcVar8 + 1;
                pcVar8 = pcVar8 + 1;
              } while (*pcVar6 != '\0');
              for (lVar7 = 0; (cVar1 = __s[lVar7], cVar1 != '\0' && (cVar1 != ':'));
                  lVar7 = lVar7 + 1) {
                pcVar8[lVar7] = cVar1;
              }
              pcVar8[lVar7] = '\0';
              (*walker_local)(pPVar5,name_buffer,old_end,base,data,runtime);
              uVar9 = local_40;
            }
            else {
              bundle_foreach<void(*)(rtosc::Port_const*,char_const*,char_const*,rtosc::Ports_const&,void*,void*)>
                        (pPVar5,__s,old_end,name_buffer,buffer_size,base,data,runtime,&walker_local,
                         SUB81(local_40,0),true,ranges);
            }
          }
          else {
            walk_ports_recurse0(pPVar5,name_buffer,buffer_size,base,data,walker_local,runtime,
                                old_end,old_end,SUB81(uVar9,0),pPVar5->name,ranges);
          }
          cVar1 = *old_end;
          pcVar8 = name_buffer + sVar4 + 1;
          while (cVar1 != '\0') {
            pcVar8[-1] = '\0';
            cVar1 = *pcVar8;
            pcVar8 = pcVar8 + 1;
          }
          pPVar5 = pPVar5 + 1;
        } while (pPVar5 != pPVar2);
      }
    }
  }
  return;
}

Assistant:

void rtosc::walk_ports(const Ports  *base,
                       char         *name_buffer,
                       size_t        buffer_size,
                       void         *data,
                       port_walker_t walker,
                       bool          expand_bundles,
                       void*         runtime,
                       bool          ranges)
{
    //only walk valid ports
    if(!base)
        return;

    assert(name_buffer);
    //XXX buffer_size is not properly handled yet
    if(name_buffer[0] == 0)
        name_buffer[0] = '/';

    char * const old_end = name_buffer + strlen(name_buffer);

    if(port_is_enabled((*base)["self:"], name_buffer, buffer_size, *base,
                       runtime, false, walker, data))
    for(const Port &p: *base) {
        //if(strchr(p.name, '/')) {//it is another tree
        if(p.ports) {//it is another tree

            walk_ports_recurse0(p, name_buffer, buffer_size,
                                base, data, walker, runtime, old_end, old_end,
                                expand_bundles, p.name, ranges);

        } else {
            if(strchr(p.name,'#')) {
                bundle_foreach(p, p.name, old_end, name_buffer, buffer_size, *base,
                               data, runtime, walker, expand_bundles, true, ranges);
            } else {
                //Append the path
                scat(name_buffer, p.name);

                //Apply walker function
                walker(&p, name_buffer, old_end, *base, data, runtime);
            }
        }

        //Remove the rest of the path
        char *tmp = old_end;
        while(*tmp) *tmp++=0;
    }
}